

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O3

bool __thiscall
libtorrent::aux::utp_socket_impl::incoming_packet
          (utp_socket_impl *this,span<const_char> b,endpoint *ep,time_point receive_time)

{
  be_uint16 *ptr;
  uint8_t uVar1;
  undefined2 uVar2;
  utp_stream *puVar3;
  char cVar4;
  bool bVar5;
  uint16_t uVar6;
  uint uVar7;
  uint32_t uVar8;
  int iVar9;
  uint uVar10;
  utp_header *ptr_00;
  pair<unsigned_int,_int> pVar11;
  packet *p;
  short sVar12;
  in_addr_t iVar13;
  uint uVar15;
  long lVar16;
  undefined8 uVar17;
  byte bVar18;
  uint32_t sample;
  ushort uVar19;
  ushort uVar20;
  state_t s;
  utp_header *ph;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  utp_socket_manager *this_00;
  ulong uVar24;
  time_point now;
  time_point now_00;
  uint8_t uVar25;
  undefined1 *puVar26;
  bool bVar27;
  undefined1 local_78 [8];
  error_category *peStack_70;
  ulong local_60;
  int local_58;
  uint32_t local_54;
  _Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
  local_50;
  int32_t local_48;
  uint local_44;
  endpoint *local_40;
  packet_buffer *local_38;
  int iVar14;
  
  ph = (utp_header *)b.m_ptr;
  utp_socket_manager::inc_stats_counter(this->m_sm,0xa5,1);
  if ((b.m_len < 0x14) || (bVar18 = ph->type_ver, (bVar18 & 0xf) != 1)) {
LAB_0038ec50:
    utp_socket_manager::inc_stats_counter(this->m_sm,0xad,1);
    return false;
  }
  if ((bVar18 & 0xf0) == 0x40) {
    if ((this->field_0x21c & 0x1c) != 0) {
LAB_0038ec2c:
      this_00 = this->m_sm;
      iVar9 = 0xad;
      goto LAB_0038ef3a;
    }
    bVar27 = (ep->impl_).data_.base.sa_family != 2;
    if (bVar27) {
      local_78 = *(undefined1 (*) [8])
                  &((__uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
                     *)((long)&(ep->impl_).data_ + 8))->_M_t;
      peStack_70 = *(error_category **)((long)&(ep->impl_).data_ + 0x10);
      uVar24 = (ulong)(ep->impl_).data_.v6.sin6_scope_id;
      iVar13 = 0;
    }
    else {
      iVar13 = (ep->impl_).data_.v4.sin_addr.s_addr;
      local_78 = (undefined1  [8])0x0;
      peStack_70 = (error_category *)0x0;
      uVar24 = 0;
    }
    (this->m_remote_address).type_ = (uint)bVar27;
    (this->m_remote_address).ipv4_address_.addr_.s_addr = iVar13;
    *(undefined1 (*) [8])&(this->m_remote_address).ipv6_address_.addr_.__in6_u = local_78;
    *(error_category **)((long)&(this->m_remote_address).ipv6_address_.addr_.__in6_u + 8) =
         peStack_70;
    (this->m_remote_address).ipv6_address_.scope_id_ = uVar24;
    uVar19 = (ep->impl_).data_.v4.sin_port;
    this->m_port = uVar19 << 8 | uVar19 >> 8;
  }
  else {
    uVar19 = *(ushort *)(ph->connection_id).m_storage;
    if (((ushort)(uVar19 << 8 | uVar19 >> 8) != this->m_recv_id) || (0x4f < bVar18))
    goto LAB_0038ec50;
  }
  puVar26 = &this->field_0x21c;
  lVar23 = (long)receive_time.__d.__r - (this->m_last_history_step).__d.__r;
  if (60000000000 < lVar23) {
    (this->m_last_history_step).__d.__r = (rep)receive_time.__d.__r;
  }
  uVar7 = 0;
  lVar16 = 4;
  do {
    uVar7 = (uint)(&((utp_header *)(&ph->connection_id + -1))->type_ver)[lVar16] | uVar7 << 8;
    lVar16 = lVar16 + 1;
  } while ((int)lVar16 != 8);
  local_40 = ep;
  if (uVar7 == 0) {
    local_54 = 0;
  }
  else {
    lVar16 = 0;
    uVar7 = 0;
    do {
      uVar7 = (uint)(byte)(ph->timestamp_microseconds).m_storage[lVar16] | uVar7 << 8;
      lVar16 = lVar16 + 1;
    } while ((int)lVar16 != 4);
    sample = (int)((long)receive_time.__d.__r / 1000) - uVar7;
    this->m_reply_micro = sample;
    uVar8 = 0;
    if ((this->m_their_delay_hist).m_num_samples != 0xffff) {
      uVar8 = (this->m_their_delay_hist).m_base;
    }
    local_54 = timestamp_history::add_sample(&this->m_their_delay_hist,sample,60000000000 < lVar23);
    if (((uVar8 != 0) && (uVar7 = (this->m_their_delay_hist).m_base - uVar8, 0xffffd8f0 < uVar7)) &&
       ((this->m_delay_hist).m_num_samples != 0xffff)) {
      timestamp_history::adjust_base(&this->m_delay_hist,-uVar7);
    }
  }
  bVar18 = ph->type_ver >> 4;
  uVar7 = *(uint *)puVar26;
  uVar22 = uVar7 >> 2 & 7;
  if ((uVar22 | 2) == 3) {
    if (bVar18 - 1 < 2) goto LAB_0038ee39;
    uVar6 = this->m_seq_nr - 1;
LAB_0038ee41:
    uVar19 = *(ushort *)(ph->ack_nr).m_storage;
    uVar19 = uVar19 << 8 | uVar19 >> 8;
    if (((ushort)(uVar6 - uVar19) <= (ushort)(uVar19 - uVar6)) &&
       (sVar12 = this->m_acked_seq_nr - 3, (ushort)(uVar19 - sVar12) <= (ushort)(sVar12 - uVar19)))
    goto LAB_0038eeb2;
LAB_0038ef31:
    this_00 = this->m_sm;
    iVar9 = 0xae;
LAB_0038ef3a:
    utp_socket_manager::inc_stats_counter(this_00,iVar9,1);
    return true;
  }
  sVar12 = (short)uVar22;
  if ((0xfd < (byte)(bVar18 - 3)) && (sVar12 == 5)) {
LAB_0038ee39:
    uVar6 = this->m_seq_nr;
    goto LAB_0038ee41;
  }
  uVar6 = this->m_seq_nr - 1;
  if (sVar12 != 0 || bVar18 != 4) goto LAB_0038ee41;
LAB_0038eeb2:
  if ((uVar7 & 0x20) != 0) {
    uVar19 = *(ushort *)(ph->seq_nr).m_storage;
    uVar20 = uVar19 << 8 | uVar19 >> 8;
    uVar19 = this->m_in_eof_seq_nr;
    if (((ushort)(uVar20 - uVar19) < (ushort)(uVar19 - uVar20)) &&
       ((byte)(bVar18 - 3) < 0xfe || uVar19 != uVar20)) {
      return true;
    }
  }
  if (ph->type_ver < 0x10) {
    utp_socket_manager::inc_stats_counter(this->m_sm,0xab,1);
    uVar7 = (uint)*(ushort *)&this->field_0x21c;
  }
  if ((uVar7 & 0x18) != 0) {
    iVar9 = this->m_receive_buffer_capacity / 0x44c;
    iVar14 = 0x10;
    if (0x10 < iVar9) {
      iVar14 = iVar9;
    }
    sVar12 = (short)iVar14 + this->m_ack_nr;
    uVar19 = *(ushort *)(ph->seq_nr).m_storage;
    uVar19 = uVar19 << 8 | uVar19 >> 8;
    if ((ushort)(uVar19 - sVar12) < (ushort)(sVar12 - uVar19)) goto LAB_0038ef31;
  }
  if ((ph->type_ver & 0xf0) == 0x30) {
    uVar19 = *(ushort *)(ph->ack_nr).m_storage;
    uVar19 = uVar19 << 8 | uVar19 >> 8;
    if ((ushort)(uVar19 - uVar6) < (ushort)(uVar6 - uVar19)) {
      return true;
    }
    (this->m_error).val_ = 0x68;
    (this->m_error).failed_ = true;
    *(undefined3 *)&(this->m_error).field_0x5 = 0;
    (this->m_error).cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
LAB_0038efa0:
    s = error_wait;
    goto LAB_0038efa8;
  }
  this->m_in_packets = this->m_in_packets + 1;
  uVar7 = 0;
  lVar16 = 8;
  do {
    uVar7 = (uint)(&((utp_header *)(&ph->connection_id + -1))->type_ver)[lVar16] | uVar7 << 8;
    lVar16 = lVar16 + 1;
  } while ((int)lVar16 != 0xc);
  uVar22 = 0;
  if (uVar7 != 0x7fffffff) {
    lVar16 = 0;
    do {
      uVar22 = (uint)(byte)(ph->timestamp_difference_microseconds).m_storage[lVar16] | uVar22 << 8;
      lVar16 = lVar16 + 1;
    } while ((int)lVar16 != 4);
    if (uVar22 == 0) {
      uVar22 = 0;
    }
    else {
      uVar8 = timestamp_history::add_sample(&this->m_delay_hist,uVar22,60000000000 < lVar23);
      uVar19 = *(ushort *)&this->field_0x21c;
      uVar20 = uVar19 + 1 & 3;
      *(ushort *)&this->field_0x21c = uVar20 | uVar19 & 0xfffc;
      (this->m_delay_sample_hist)._M_elems[uVar19 & 3] = uVar8;
      uVar22 = 1;
      if (uVar20 == 3) {
        *(ushort *)puVar26 = uVar19 & 0xfffc;
      }
    }
  }
  local_48 = this->m_bytes_in_flight;
  uVar7 = 0;
  lVar23 = 0xc;
  do {
    uVar7 = (uint)(&((utp_header *)(&ph->connection_id + -1))->type_ver)[lVar23] | uVar7 << 8;
    lVar23 = lVar23 + 1;
  } while ((int)lVar23 != 0x10);
  this->m_adv_wnd = uVar7;
  uVar19 = *(ushort *)(ph->ack_nr).m_storage;
  uVar20 = this->m_acked_seq_nr;
  if ((((ushort)(uVar19 << 8 | uVar19 >> 8) == uVar20) && ((this->m_outbuf).m_size != 0)) &&
     ((ph->type_ver & 0xf0) == 0x20)) {
    this->m_duplicate_acks = this->m_duplicate_acks + '\x01';
  }
  uVar7 = 0xffffffff;
  uVar24 = 0;
  if ((*puVar26 & 0x1c) != 0) {
    uVar19 = *(ushort *)(ph->ack_nr).m_storage;
    uVar19 = uVar19 << 8 | uVar19 >> 8;
    uVar15 = (uint)uVar19;
    uVar10 = (uint)uVar20;
    if ((uVar15 - uVar10 & 0xffff) < (uVar10 - uVar15 & 0xffff)) {
      if (uVar20 == uVar19) {
        uVar7 = 0xffffffff;
        uVar24 = 0;
      }
      else {
        iVar9 = uVar15 + 1;
        uVar10 = uVar10 + 1;
        local_38 = &this->m_outbuf;
        uVar15 = 0;
        uVar7 = 0xffffffff;
        local_58 = iVar9;
        do {
          if ((uVar10 & 0xffff) == (uint)this->m_fast_resend_seq_nr) {
            this->m_fast_resend_seq_nr = this->m_fast_resend_seq_nr + 1;
          }
          packet_buffer::remove((packet_buffer *)local_78,(char *)local_38);
          if ((_Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
               )local_78 !=
              (unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)0x0) {
            local_60 = (ulong)*(ushort *)((long)local_78 + 10);
            local_44 = (uint)*(ushort *)((long)local_78 + 0xc);
            local_50._M_head_impl =
                 (unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)local_78;
            local_78 = (undefined1  [8])0x0;
            uVar8 = ack_packet(this,(packet_ptr *)&local_50,receive_time,(uint16_t)uVar10);
            if (local_50._M_head_impl !=
                (unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)0x0) {
              free(local_50._M_head_impl);
            }
            uVar15 = ((int)local_60 - local_44) + uVar15;
            local_50._M_head_impl =
                 (unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)0x0;
            if (uVar8 < uVar7) {
              uVar7 = uVar8;
            }
            iVar9 = local_58;
            if ((_Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
                 )local_78 !=
                (_Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
                 )0x0) {
              free((void *)local_78);
              iVar9 = local_58;
            }
          }
          uVar24 = (ulong)uVar15;
          uVar10 = (uVar10 & 0xffff) + 1;
        } while ((short)iVar9 != (short)uVar10);
      }
      maybe_inc_acked_seq_nr(this);
      if ((this->m_outbuf).m_size == 0) {
        this->m_duplicate_acks = '\0';
      }
    }
  }
  ptr_00 = ph + 1;
  if (ph->extension != '\0') {
    uVar21 = (ulong)(int)b.m_len;
    local_60 = uVar21;
    uVar25 = ph->extension;
    do {
      if ((long)uVar21 < (long)ptr_00 + (2 - (long)ph)) goto LAB_0038ec2c;
      ptr = &ptr_00->connection_id;
      bVar18 = ptr_00->extension;
      if ((long)uVar21 < (long)((long)ptr + ((ulong)bVar18 - (long)ph))) goto LAB_0038ec2c;
      uVar1 = ptr_00->type_ver;
      if (uVar25 == '\x03') {
        if (((bVar18 == 4) && (puVar3 = this->m_userdata, puVar3 != (utp_stream *)0x0)) &&
           (((*puVar26 & 0x80) != 0 && (puVar3->m_impl != (utp_socket_impl *)0x0)))) {
          uVar19 = *(ushort *)(ptr_00->timestamp_microseconds).m_storage;
          puVar3->m_incoming_close_reason = uVar19 << 8 | uVar19 >> 8;
        }
      }
      else if (uVar25 == '\x01') {
        uVar19 = *(ushort *)(ph->ack_nr).m_storage;
        pVar11 = parse_sack(this,uVar19 << 8 | uVar19 >> 8,(uint8_t *)ptr,(uint)bVar18,receive_time)
        ;
        uVar24 = (ulong)pVar11 >> 0x20;
        uVar21 = local_60;
        if (pVar11.first <= uVar7) {
          uVar7 = pVar11.first;
        }
      }
      ptr_00 = (utp_header *)(ptr->m_storage + bVar18);
      uVar25 = uVar1;
    } while (uVar1 != '\0');
  }
  this->m_num_timeouts = '\0';
  local_60 = uVar24;
  iVar9 = packet_timeout(this);
  (this->m_timeout).__d.__r = (long)iVar9 * 1000000 + (long)receive_time.__d.__r;
  if ((2 < this->m_duplicate_acks) &&
     (uVar10 = *(int *)&this->m_acked_seq_nr + 1, (uint16_t)uVar10 == this->m_fast_resend_seq_nr)) {
    p = packet_buffer::at(&this->m_outbuf,uVar10 & 0xffff);
    uVar19 = this->m_fast_resend_seq_nr + 1;
    this->m_fast_resend_seq_nr = uVar19;
    if (p != (packet *)0x0) {
      if (-1 < (char)p->field_0xe) {
        experienced_loss(this,(uint)uVar19,receive_time);
      }
      resend_packet(this,p,true);
    }
  }
  now.__d.__r._0_4_ = ((int)b.m_ptr - (int)ptr_00) + (int)b.m_len;
  bVar18 = ph->type_ver >> 4;
  if (bVar18 == 1) {
    uVar19 = *(ushort *)(ph->seq_nr).m_storage;
    uVar19 = uVar19 << 8 | uVar19 >> 8;
    uVar2 = this->m_ack_nr;
    if (uVar19 == (ushort)(uVar2 + 1) || uVar19 == uVar2) {
      this->m_ack_nr = uVar19;
    }
    if ((*(ushort *)puVar26 & 0x20) == 0) {
      *(ushort *)&this->field_0x21c = *(ushort *)puVar26 | 0x20;
      uVar19 = *(ushort *)(ph->seq_nr).m_storage;
      this->m_in_eof_seq_nr = (ushort)(0 < (int)(uint)now.__d.__r) + (uVar19 << 8 | uVar19 >> 8);
    }
    if ((*(uint *)puVar26 >> 0xc & 1) == 0) {
      *(ushort *)&this->field_0x21c = (ushort)*(uint *)puVar26 | 0x1000;
      utp_socket_manager::defer_ack(this->m_sm,this);
    }
    if (this->m_ack_nr != this->m_in_eof_seq_nr) {
      return true;
    }
    if ((this->m_receive_buffer).
        super__Vector_base<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::allocator<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->m_receive_buffer).
        super__Vector_base<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::allocator<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return true;
    }
    if ((DAT_004ecee8 != -0x70502de1da3a1f65) && (DAT_004ecee8 != -0x4d54ee85da8120f3)) {
      cVar4 = (**(code **)(boost::asio::error::get_misc_category()::instance + 0x30))
                        (&boost::asio::error::get_misc_category()::instance,2);
      local_78 = (undefined1  [8])0x2;
      if (cVar4 == '\0') goto LAB_0038f4f8;
    }
    local_78 = (undefined1  [8])0x100000002;
LAB_0038f4f8:
    peStack_70 = (error_category *)&boost::asio::error::get_misc_category()::instance;
    maybe_trigger_receive_callback(this,(error_code *)local_78);
    return true;
  }
  uVar10 = *(uint *)puVar26;
  switch(uVar10 >> 2 & 7) {
  case 0:
    if (bVar18 != 4) {
      return true;
    }
    set_state(this,connected);
    bVar27 = (local_40->impl_).data_.base.sa_family != 2;
    if (bVar27) {
      local_78 = *(undefined1 (*) [8])
                  &((__uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
                     *)((long)&(local_40->impl_).data_ + 8))->_M_t;
      peStack_70 = *(error_category **)((long)&(local_40->impl_).data_ + 0x10);
      uVar24 = (ulong)(local_40->impl_).data_.v6.sin6_scope_id;
      iVar13 = 0;
    }
    else {
      iVar13 = (local_40->impl_).data_.v4.sin_addr.s_addr;
      local_78 = (undefined1  [8])0x0;
      peStack_70 = (error_category *)0x0;
      uVar24 = 0;
    }
    (this->m_remote_address).type_ = (uint)bVar27;
    (this->m_remote_address).ipv4_address_.addr_.s_addr = iVar13;
    *(undefined1 (*) [8])&(this->m_remote_address).ipv6_address_.addr_.__in6_u = local_78;
    *(error_category **)((long)&(this->m_remote_address).ipv6_address_.addr_.__in6_u + 8) =
         peStack_70;
    (this->m_remote_address).ipv6_address_.scope_id_ = uVar24;
    uVar19 = (local_40->impl_).data_.v4.sin_port;
    this->m_port = uVar19 << 8 | uVar19 >> 8;
    uVar19 = *(ushort *)(ph->seq_nr).m_storage;
    this->m_ack_nr = uVar19 << 8 | uVar19 >> 8;
    lVar23 = random((aux *)0xffff);
    uVar6 = (uint16_t)lVar23;
    this->m_seq_nr = uVar6;
    this->m_acked_seq_nr = uVar6 - 1;
    this->m_loss_seq_nr = uVar6 - 1;
    this->m_fast_resend_seq_nr = uVar6;
    uVar19 = *(ushort *)(ph->connection_id).m_storage;
    if (this->m_send_id != (uint16_t)(uVar19 << 8 | uVar19 >> 8)) {
      return false;
    }
    if ((*(uint *)puVar26 >> 0xc & 1) == 0) {
      *(ushort *)&this->field_0x21c = (ushort)*(uint *)puVar26 | 0x1000;
      utp_socket_manager::defer_ack(this->m_sm,this);
      return true;
    }
    return true;
  case 1:
    break;
  case 2:
    goto switchD_0038f53a_caseD_2;
  case 3:
    if ((uVar10 >> 0xc & 1) == 0 && ph->type_ver < 0x10) {
      *(ushort *)&this->field_0x21c = (ushort)uVar10 | 0x1000;
      utp_socket_manager::defer_ack(this->m_sm,this);
    }
    now_00.__d.__r._4_4_ = 0;
    now_00.__d.__r._0_4_ = (uint)now.__d.__r;
    bVar27 = consume_incoming_data(this,ph,&ptr_00->type_ver,(uint)now.__d.__r,now_00);
    if (bVar27) {
      return true;
    }
    if (this->m_acked_seq_nr != this->m_seq_nr) {
      return true;
    }
    if ((this->field_0x21c & 0x80) != 0) {
      if ((DAT_004ecee8 == -0x70502de1da3a1f65) || (DAT_004ecee8 == -0x4d54ee85da8120f3)) {
LAB_0038f8e2:
        uVar17 = 0x100000002;
      }
      else {
        cVar4 = (**(code **)(boost::asio::error::get_misc_category()::instance + 0x30))
                          (&boost::asio::error::get_misc_category()::instance,2);
        uVar17 = 2;
        if (cVar4 != '\0') goto LAB_0038f8e2;
      }
      (this->m_error).val_ = (int)uVar17;
      (this->m_error).failed_ = (bool)(char)((ulong)uVar17 >> 0x20);
      *(int3 *)&(this->m_error).field_0x5 = (int3)((ulong)uVar17 >> 0x28);
      (this->m_error).cat_ = (error_category *)&boost::asio::error::get_misc_category()::instance;
      goto LAB_0038efa0;
    }
    if ((DAT_004ecee8 == -0x70502de1da3a1f65) || (DAT_004ecee8 == -0x4d54ee85da8120f3)) {
LAB_0038f740:
      uVar17 = 0x100000002;
    }
    else {
      cVar4 = (**(code **)(boost::asio::error::get_misc_category()::instance + 0x30))
                        (&boost::asio::error::get_misc_category()::instance,2);
      uVar17 = 2;
      if (cVar4 != '\0') goto LAB_0038f740;
    }
    (this->m_error).val_ = (int)uVar17;
    (this->m_error).failed_ = (bool)(char)((ulong)uVar17 >> 0x20);
    *(int3 *)&(this->m_error).field_0x5 = (int3)((ulong)uVar17 >> 0x28);
    (this->m_error).cat_ = (error_category *)&boost::asio::error::get_misc_category()::instance;
    s = deleting;
LAB_0038efa8:
    set_state(this,s);
    test_socket_state(this);
    return true;
  default:
    return true;
  }
  uVar19 = *(ushort *)(ph->ack_nr).m_storage;
  if ((ushort)(uVar19 << 8 | uVar19 >> 8) != (ushort)(this->m_seq_nr - 1)) {
    return true;
  }
  set_state(this,connected);
  uVar19 = *(ushort *)(ph->seq_nr).m_storage;
  this->m_ack_nr = ((uVar19 << 8 | uVar19 >> 8) - 1) + (ushort)(ph->type_ver < 0x10);
  if (this->m_connect_handler == true) {
    this->m_connect_handler = false;
    utp_stream::on_connect(this->m_userdata,&this->m_error,false);
  }
switchD_0038f53a_caseD_2:
  now.__d.__r._4_4_ = 0;
  if (((byte)uVar22 & local_48 != 0 & (int)local_60 != 0) == 1) {
    uVar22 = (this->m_delay_sample_hist)._M_elems[0];
    uVar10 = (this->m_delay_sample_hist)._M_elems[1];
    uVar15 = uVar22;
    if (uVar10 < uVar22) {
      uVar15 = uVar10;
    }
    lVar23 = 0x1dc;
    if (uVar15 <= (this->m_delay_sample_hist)._M_elems[2]) {
      lVar23 = (ulong)(uVar10 < uVar22) * 4 + 0x1d4;
    }
    uVar22 = *(uint *)((long)&(this->m_sock).
                              super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + lVar23);
    if (uVar7 <= uVar22) {
      uVar22 = uVar7;
    }
    do_ledbat(this,(int)local_60,uVar22,local_48);
    this->m_send_delay = uVar22;
  }
  uVar8 = local_54;
  if (uVar7 < local_54) {
    uVar8 = uVar7;
  }
  this->m_recv_delay = uVar8;
  consume_incoming_data(this,ph,&ptr_00->type_ver,(uint)now.__d.__r,now);
  bVar18 = ph->type_ver;
  if (bVar18 < 0x20) {
    uVar8 = this->m_out_packets;
  }
  else {
    uVar8 = this->m_out_packets;
    bVar27 = true;
    if ((bVar18 & 0xf0) == 0x40) goto LAB_0038f784;
  }
  this->field_0x21d = this->field_0x21d | 0x80;
  bVar27 = bVar18 < 0x20;
LAB_0038f784:
  do {
    bVar5 = send_pkt(this,0);
  } while (bVar5);
  uVar19 = *(ushort *)puVar26;
  if ((bool)((uVar19 >> 0xc & 1) == 0 & bVar27 & uVar8 == this->m_out_packets)) {
    *(ushort *)&this->field_0x21c = uVar19 | 0x1000;
    utp_socket_manager::defer_ack(this->m_sm,this);
    uVar19 = *(ushort *)&this->field_0x21c;
  }
  if ((uVar19 >> 0xd & 1) == 0) {
    *(ushort *)&this->field_0x21c = uVar19 | 0x2000;
    utp_socket_manager::subscribe_drained(this->m_sm,this);
    return true;
  }
  return true;
}

Assistant:

bool utp_socket_impl::incoming_packet(span<char const> b
	, udp::endpoint const& ep, time_point receive_time)
{
	INVARIANT_CHECK;
	span<std::uint8_t const> const buf(reinterpret_cast<std::uint8_t const*>(b.data()), b.size());

	auto const* ph = reinterpret_cast<utp_header const*>(buf.data());
	m_sm.inc_stats_counter(counters::utp_packets_in);

	if (buf.size() < int(sizeof(utp_header)))
	{
		UTP_LOG("%8p: ERROR: incoming packet size too small:%d (ignored)\n"
			, static_cast<void*>(this), int(buf.size()));
		m_sm.inc_stats_counter(counters::utp_invalid_pkts_in);
		return false;
	}

	if (ph->get_version() != 1)
	{
		UTP_LOG("%8p: ERROR: incoming packet version:%d (ignored)\n"
			, static_cast<void*>(this), int(ph->get_version()));
		m_sm.inc_stats_counter(counters::utp_invalid_pkts_in);
		return false;
	}

	// SYN packets have special (reverse) connection ids
	if (ph->get_type() != ST_SYN && ph->connection_id != m_recv_id)
	{
		UTP_LOG("%8p: ERROR: incoming packet id:%d expected:%d (ignored)\n"
			, static_cast<void*>(this), int(ph->connection_id), int(m_recv_id));
		m_sm.inc_stats_counter(counters::utp_invalid_pkts_in);
		return false;
	}

	if (ph->get_type() >= NUM_TYPES)
	{
		UTP_LOG("%8p: ERROR: incoming packet type:%d (ignored)\n"
			, static_cast<void*>(this), int(ph->get_type()));
		m_sm.inc_stats_counter(counters::utp_invalid_pkts_in);
		return false;
	}

	if (state() == state_t::none && ph->get_type() == ST_SYN)
	{
		m_remote_address = ep.address();
		m_port = ep.port();
	}

	if (state() != state_t::none && ph->get_type() == ST_SYN)
	{
		UTP_LOG("%8p: ERROR: incoming packet type:ST_SYN (ignored)\n"
			, static_cast<void*>(this));
		m_sm.inc_stats_counter(counters::utp_invalid_pkts_in);
		return true;
	}

	bool step = false;
	if (receive_time - m_last_history_step > minutes(1))
	{
		step = true;
		m_last_history_step = receive_time;
	}

	// this is the difference between their send time and our receive time
	// 0 means no sample yet
	std::uint32_t their_delay = 0;
	if (ph->timestamp_microseconds != 0)
	{
		auto timestamp = static_cast<std::uint32_t>(total_microseconds(
			receive_time.time_since_epoch()) & 0xffffffff);
		m_reply_micro = timestamp - ph->timestamp_microseconds;
		std::uint32_t const prev_base = m_their_delay_hist.initialized() ? m_their_delay_hist.base() : 0;
		their_delay = m_their_delay_hist.add_sample(m_reply_micro, step);
		int const base_change = int(m_their_delay_hist.base() - prev_base);
		UTP_LOGV("%8p: their_delay::add_sample:%u prev_base:%u new_base:%u\n"
			, static_cast<void*>(this), m_reply_micro, prev_base, m_their_delay_hist.base());

		if (prev_base && base_change < 0 && base_change > -10000 && m_delay_hist.initialized())
		{
			// their base delay went down. This is caused by clock drift. To compensate,
			// adjust our base delay upwards
			// don't adjust more than 10 ms. If the change is that big, something is probably wrong
			m_delay_hist.adjust_base(-base_change);
		}

		UTP_LOGV("%8p: incoming packet reply_micro:%u base_change:%d\n"
			, static_cast<void*>(this), m_reply_micro, prev_base ? base_change : 0);
	}

	bool const state_or_fin = ph->get_type() == ST_STATE
		|| ph->get_type() == ST_FIN;

	// is this ACK valid? If the other end is ACKing
	// a packet that hasn't been sent yet
	// just ignore it. A 3rd party could easily inject a packet
	// like this in a stream, don't sever it because of it.
	// since m_seq_nr is the sequence number of the next packet
	// we'll send (and m_seq_nr-1 was the last packet we sent),
	// if the ACK we got is greater than the last packet we sent
	// something is wrong.
	// If our state is state_none, this packet must be a syn packet
	// and the ack_nr should be ignored
	// Note that when we send a FIN, we don't increment m_seq_nr
	std::uint16_t const cmp_seq_nr =
		((state() == state_t::syn_sent
		  || state() == state_t::fin_sent
		  || state() == state_t::deleting)
			&& state_or_fin)
		? m_seq_nr : (m_seq_nr - 1) & ACK_MASK;

	if ((state() != state_t::none || ph->get_type() != ST_SYN)
		&& (compare_less_wrap(cmp_seq_nr, ph->ack_nr, ACK_MASK)
			|| compare_less_wrap(ph->ack_nr, m_acked_seq_nr
				- dup_ack_limit, ACK_MASK)))
	{
		UTP_LOG("%8p: ERROR: incoming packet ack_nr:%d our seq_nr:%d our "
			"acked_seq_nr:%d (ignored)\n"
			, static_cast<void*>(this), int(ph->ack_nr), m_seq_nr, m_acked_seq_nr);
		m_sm.inc_stats_counter(counters::utp_redundant_pkts_in);
		return true;
	}

	// if the socket is closing, always ignore any packet
	// with a higher sequence number than the FIN sequence number
	// ST_STATE messages always include the next seqnr, so it's acceptable to
	// receive the same seq_nr as the EOF as long as it's a STATE or FIN packet
	if (m_in_eof
		&& compare_less_wrap(m_in_eof_seq_nr, ph->seq_nr, ACK_MASK)
		&& !(m_in_eof_seq_nr == ph->seq_nr && state_or_fin))
	{
#if TORRENT_UTP_LOG
		UTP_LOG("%8p: ERROR: incoming payload after FIN type: %s seq_nr:%d eof_seq_nr:%d (ignored)\n"
			, static_cast<void*>(this), packet_type_names[ph->get_type()], int(ph->seq_nr), m_in_eof_seq_nr);
#endif
		return true;
	}

	if (ph->get_type() == ST_DATA)
		m_sm.inc_stats_counter(counters::utp_payload_pkts_in);

	// the number of packets that'll fit in the reorder buffer
	std::uint32_t const max_packets_reorder
		= static_cast<std::uint32_t>(std::max(16, m_receive_buffer_capacity / 1100));

	if (state() != state_t::none
		&& state() != state_t::syn_sent
		&& compare_less_wrap((m_ack_nr + max_packets_reorder) & ACK_MASK, ph->seq_nr, ACK_MASK))
	{
		// this is too far out to fit in our reorder buffer. Drop it
		// This is either an attack to try to break the connection
		// or a seriously damaged connection that lost a lot of
		// packets. Neither is very likely, and it should be OK
		// to drop the timestamp information.
		UTP_LOG("%8p: ERROR: incoming packet seq_nr:%d our ack_nr:%d (ignored)\n"
			, static_cast<void*>(this), int(ph->seq_nr), m_ack_nr);
		m_sm.inc_stats_counter(counters::utp_redundant_pkts_in);
		return true;
	}

	if (ph->get_type() == ST_RESET)
	{
		if (compare_less_wrap(cmp_seq_nr, ph->ack_nr, ACK_MASK))
		{
			UTP_LOG("%8p: ERROR: invalid RESET packet, ack_nr:%d our seq_nr:%d (ignored)\n"
				, static_cast<void*>(this), int(ph->ack_nr), m_seq_nr);
			return true;
		}
		UTP_LOGV("%8p: incoming packet type:RESET\n", static_cast<void*>(this));
		m_error = boost::asio::error::connection_reset;
		set_state(state_t::error_wait);
		test_socket_state();
		return true;
	}

	++m_in_packets;

	// the test for INT_MAX here is a work-around for a bug in uTorrent where
	// it's sometimes sent as INT_MAX when it is in fact uninitialized
	const std::uint32_t sample = ph->timestamp_difference_microseconds == INT_MAX
		? 0 : ph->timestamp_difference_microseconds;

	std::uint32_t delay = 0;
	if (sample != 0)
	{
		delay = m_delay_hist.add_sample(sample, step);
		m_delay_sample_hist[m_delay_sample_idx++] = delay;
		if (m_delay_sample_idx >= m_delay_sample_hist.size())
			m_delay_sample_idx = 0;
	}

	int acked_bytes = 0;

	TORRENT_ASSERT(m_bytes_in_flight >= 0);
	int prev_bytes_in_flight = m_bytes_in_flight;

	m_adv_wnd = ph->wnd_size;

	// if we get an ack for the same sequence number as
	// was last ACKed, and we have outstanding packets,
	// it counts as a duplicate ack. The reason to not count ST_DATA packets as
	// duplicate ACKs is because we may be receiving a stream of those
	// regardless of our outgoing traffic, which makes their ACK number not
	// indicative of a dropped packet
	if (ph->ack_nr == m_acked_seq_nr
		&& m_outbuf.size()
		&& ph->get_type() == ST_STATE)
	{
		++m_duplicate_acks;
	}

	TORRENT_ASSERT_VAL(m_outbuf.size() > 0 || m_duplicate_acks == 0, m_duplicate_acks);

	std::uint32_t min_rtt = std::numeric_limits<std::uint32_t>::max();

	TORRENT_ASSERT(m_outbuf.at((m_acked_seq_nr + 1) & ACK_MASK) || ((m_seq_nr - m_acked_seq_nr) & ACK_MASK) <= 1);

	// has this packet already been ACKed?
	// if the ACK we just got is less than the max ACKed
	// sequence number, it doesn't tell us anything.
	// So, only act on it if the ACK is greater than the last acked
	// sequence number
	if (state() != state_t::none && compare_less_wrap(m_acked_seq_nr, ph->ack_nr, ACK_MASK))
	{
		int const next_ack_nr = ph->ack_nr;

		for (int ack_nr = (m_acked_seq_nr + 1) & ACK_MASK;
			ack_nr != ((next_ack_nr + 1) & ACK_MASK);
			ack_nr = (ack_nr + 1) & ACK_MASK)
		{
			if (m_fast_resend_seq_nr == ack_nr)
				m_fast_resend_seq_nr = (m_fast_resend_seq_nr + 1) & ACK_MASK;
			packet_ptr p = m_outbuf.remove(aux::numeric_cast<packet_buffer::index_type>(ack_nr));

			if (!p) continue;

			acked_bytes += p->size - p->header_size;
			std::uint32_t const rtt = ack_packet(std::move(p), receive_time, std::uint16_t(ack_nr));
			min_rtt = std::min(min_rtt, rtt);
		}

		maybe_inc_acked_seq_nr();
		if (m_outbuf.empty()) m_duplicate_acks = 0;
	}

	// look for extended headers
	std::uint8_t const* ptr = buf.data();
	int const size = int(buf.size());
	ptr += sizeof(utp_header);

	std::uint8_t extension = ph->extension;
	while (extension)
	{
		// invalid packet. It says it has an extension header
		// but the packet is too short
		if (ptr - buf.data() + 2 > size)
		{
			UTP_LOG("%8p: ERROR: invalid extension header\n", static_cast<void*>(this));
			m_sm.inc_stats_counter(counters::utp_invalid_pkts_in);
			return true;
		}
		std::uint8_t const next_extension = *ptr++;
		int const len = *ptr++;
		if (ptr - buf.data() + len > size)
		{
			UTP_LOG("%8p: ERROR: invalid extension header size:%d packet:%d\n"
				, static_cast<void*>(this), len, int(ptr - buf.data()));
			m_sm.inc_stats_counter(counters::utp_invalid_pkts_in);
			return true;
		}
		switch(extension)
		{
			case utp_sack: // selective ACKs
			{
				std::uint32_t rtt;
				std::tie(rtt, acked_bytes) = parse_sack(ph->ack_nr, ptr, len, receive_time);
				min_rtt = std::min(min_rtt, rtt);
				break;
			}
			case utp_close_reason:
				parse_close_reason(ptr, len);
				break;
		}
		ptr += len;
		extension = next_extension;
	}

	// this is a valid incoming packet, update the timeout timer
	// do this after processing sacks/acks as that can effect packet_timeout()
	m_num_timeouts = 0;
	m_timeout = receive_time + milliseconds(packet_timeout());
	UTP_LOGV("%8p: updating timeout to: now + %d\n"
		, static_cast<void*>(this), packet_timeout());

	if (m_duplicate_acks >= dup_ack_limit
		&& ((m_acked_seq_nr + 1) & ACK_MASK) == m_fast_resend_seq_nr)
	{
		// LOSS

		UTP_LOGV("%8p: Packet %d lost. (%d duplicate acks, trigger fast-resend)\n"
			, static_cast<void*>(this), m_fast_resend_seq_nr, m_duplicate_acks);

		// resend the lost packet
		packet* p = m_outbuf.at(m_fast_resend_seq_nr);
		TORRENT_ASSERT(p);

		// don't fast-resend this again
		m_fast_resend_seq_nr = (m_fast_resend_seq_nr + 1) & ACK_MASK;

		if (p)
		{
			// don't consider a lost probe as proper loss, it doesn't necessarily
			// signal congestion
			if (!p->mtu_probe) experienced_loss(m_fast_resend_seq_nr, receive_time);
			resend_packet(p, true);
		}
	}

	// ptr points to the payload of the packet
	// size is the packet size, payload is the
	// number of payload bytes are in this packet
	const int header_size = int(ptr - buf.data());
	const int payload_size = size - header_size;

#if TORRENT_UTP_LOG
	UTP_LOGV("%8p: incoming packet seq_nr:%d ack_nr:%d type:%s id:%d size:%d timestampdiff:%u timestamp:%u "
			"our ack_nr:%d our seq_nr:%d our acked_seq_nr:%d our state:%s\n"
		, static_cast<void*>(this), int(ph->seq_nr), int(ph->ack_nr), packet_type_names[ph->get_type()]
		, int(ph->connection_id), payload_size, std::uint32_t(ph->timestamp_difference_microseconds)
		, std::uint32_t(ph->timestamp_microseconds), m_ack_nr, m_seq_nr, m_acked_seq_nr, socket_state_names[m_state]);
#endif

	if (ph->get_type() == ST_FIN)
	{
		// We ignore duplicate FIN packets, but we still need to ACK them.
		if (ph->seq_nr == ((m_ack_nr + 1) & ACK_MASK)
			|| ph->seq_nr == m_ack_nr)
		{
			UTP_LOGV("%8p: FIN received in order\n", static_cast<void*>(this));

			// The FIN arrived in order, nothing else is in the
			// reorder buffer.
			m_ack_nr = ph->seq_nr;
		}
		else
		{
			UTP_LOGV("%8p: FIN received out-of-order\n", static_cast<void*>(this));
		}

		if (payload_size > 0)
		{
			UTP_LOGV("%8p: FIN packet carries payload, which is not allowed (%d bytes)\n"
				, static_cast<void*>(this), payload_size);
		}

		if (m_in_eof)
		{
			UTP_LOGV("%8p: duplicate FIN packet (not updating, m_in_eof_seq_nr=%d)\n"
				, static_cast<void*>(this), m_in_eof_seq_nr);
		}
		else
		{
			m_in_eof = true;
			// even though invalid, tolerate FIN packets with payload
			if (payload_size > 0)
				m_in_eof_seq_nr = (ph->seq_nr + 1) & ACK_MASK;
			else
				m_in_eof_seq_nr = ph->seq_nr;
			UTP_LOGV("%8p: in_eof_seq_nr=%d m_receive_buffer=%d\n"
				, static_cast<void*>(this), m_in_eof_seq_nr, int(m_receive_buffer.size()));
		}

		defer_ack();

		if (m_ack_nr == m_in_eof_seq_nr && m_receive_buffer.empty())
			maybe_trigger_receive_callback(boost::asio::error::eof);
		return true;
	}

	// the send operation in parse_sack() may have set the socket to an error
	// state, in which case we shouldn't continue
	if (state() == state_t::error_wait || state() == state_t::deleting) return true;

	switch (state())
	{
		case state_t::none:
		{
			if (ph->get_type() == ST_SYN)
			{
				// if we're in state_none, the only thing
				// we accept are SYN packets.
				set_state(state_t::connected);

				m_remote_address = ep.address();
				m_port = ep.port();

				m_ack_nr = ph->seq_nr;
				m_seq_nr = std::uint16_t(random(0xffff));
				m_acked_seq_nr = (m_seq_nr - 1) & ACK_MASK;
				m_loss_seq_nr = m_acked_seq_nr;
				m_fast_resend_seq_nr = m_seq_nr;

#if TORRENT_UTP_LOG
				UTP_LOGV("%8p: received ST_SYN state:%s seq_nr:%d ack_nr:%d\n"
					, static_cast<void*>(this), socket_state_names[m_state], m_seq_nr, m_ack_nr);
#endif
				if (m_send_id != ph->connection_id)
				{
#if TORRENT_UTP_LOG
					UTP_LOGV("%8p: received invalid connection_id:%d expected: %d\n"
						, static_cast<void*>(this), int(ph->connection_id), int(m_send_id));
#endif
					return false;
				}
				TORRENT_ASSERT(m_recv_id == ((m_send_id + 1) & 0xffff));

				defer_ack();
			}
			else
			{
#if TORRENT_UTP_LOG
				UTP_LOG("%8p: ERROR: type:%s state:%s (ignored)\n"
					, static_cast<void*>(this), packet_type_names[ph->get_type()], socket_state_names[m_state]);
#endif
			}
			break;
		}
		case state_t::syn_sent:
		{
			// just wait for an ack to our SYN, ignore everything else
			if (ph->ack_nr != ((m_seq_nr - 1) & ACK_MASK))
			{
#if TORRENT_UTP_LOG
				UTP_LOGV("%8p: incorrect ack_nr (%d) waiting for %d\n"
					, static_cast<void*>(this), int(ph->ack_nr), (m_seq_nr - 1) & ACK_MASK);
#endif
				break;
			}

			TORRENT_ASSERT(!m_error);
			set_state(state_t::connected);
#if TORRENT_UTP_LOG
			UTP_LOGV("%8p: state:%s\n", static_cast<void*>(this), socket_state_names[m_state]);
#endif

			// only progress our ack_nr on ST_DATA messages
			// since our m_ack_nr is uninitialized at this point
			// we still need to set it to something regardless
			if (ph->get_type() == ST_DATA)
				m_ack_nr = ph->seq_nr;
			else
				m_ack_nr = (ph->seq_nr - 1) & ACK_MASK;

			// notify the client that the socket connected
			if (m_connect_handler)
			{
				m_connect_handler = false;
				utp_stream::on_connect(m_userdata, m_error, false);
			}
			BOOST_FALLTHROUGH;
		}
		// fall through
		case state_t::connected:
		{
			// the lowest seen RTT can be used to clamp the delay
			// within reasonable bounds. The one-way delay is never
			// higher than the round-trip time.

			if (sample && acked_bytes && prev_bytes_in_flight)
			{
				// only use the minimum from the last 3 delay measurements
				delay = *std::min_element(m_delay_sample_hist.begin()
					, m_delay_sample_hist.end());

				// it's impossible for delay to be more than the RTT, so make
				// sure to clamp it as a sanity check
				if (delay > min_rtt) delay = min_rtt;

				do_ledbat(acked_bytes, int(delay), prev_bytes_in_flight);
				m_send_delay = std::int32_t(delay);
			}

			m_recv_delay = std::int32_t(std::min(their_delay, min_rtt));

			consume_incoming_data(ph, ptr, payload_size, receive_time);

			// the parameter to send_pkt tells it if we're acking data
			// If we are, we'll send an ACK regardless of if we have any
			// space left in our send window or not. If we just got an ACK
			// (i.e. ST_STATE) we're not ACKing anything. If we just
			// received a FIN packet, we need to ack that as well
			bool const has_ack = ph->get_type() == ST_DATA
				|| ph->get_type() == ST_FIN
				|| ph->get_type() == ST_SYN;

			std::uint32_t prev_out_packets = m_out_packets;

			// the connection is connected and this packet made it past all the
			// checks. We can now assume the other end is not spoofing it's IP.
			if (ph->get_type() != ST_SYN) m_confirmed = true;

			// try to send more data as long as we can
			// if send_pkt returns true
			while (send_pkt());

			if (has_ack && prev_out_packets == m_out_packets)
			{
				// we need to ack some data we received, and we didn't
				// end up sending any payload packets in the loop
				// above (because m_out_packets would have been incremented
				// in that case). This means we need to send an ack.
				// don't do it right away, because we may still receive
				// more packets. defer the ack to send as few acks as possible
				defer_ack();
			}

			// we may want to call the user callback function at the end
			// of this round. Subscribe to that event
			subscribe_drained();

			if (state() == state_t::error_wait || state() == state_t::deleting) return true;

			// Everything up to the FIN has been received
			if (m_in_eof && m_ack_nr == ((m_in_eof_seq_nr - 1) & ACK_MASK))
			{
				UTP_LOGV("%8p: incoming stream at EOF\n", static_cast<void*>(this));
				if (state() == state_t::error_wait || state() == state_t::deleting) return true;
			}

			TORRENT_ASSERT(!compare_less_wrap(m_seq_nr, m_acked_seq_nr, ACK_MASK));

#if TORRENT_UTP_LOG
			if (sample && acked_bytes && prev_bytes_in_flight)
			{
				char their_delay_base[20];
				if (m_their_delay_hist.initialized())
					std::snprintf(their_delay_base, sizeof(their_delay_base), "%u", m_their_delay_hist.base());
				else
					strcpy(their_delay_base, "-");

				char our_delay_base[20];
				if (m_delay_hist.initialized())
					std::snprintf(our_delay_base, sizeof(our_delay_base), "%u", m_delay_hist.base());
				else
					strcpy(our_delay_base, "-");

				UTP_LOG("%8p: "
					"actual_delay:%u "
					"our_delay:%f "
					"their_delay:%f "
					"off_target:%f "
					"max_window:%u "
					"upload_rate:%d "
					"delay_base:%s "
					"delay_sum:%f "
					"target_delay:%d "
					"acked_bytes:%d "
					"cur_window:%d "
					"scaled_gain:%f "
					"rtt:%u "
					"rate:%d "
					"quota:%d "
					"wnduser:%u "
					"rto:%d "
					"timeout:%d "
					"get_microseconds:%u "
					"cur_window_packets:%u "
					"packet_size:%d "
					"their_delay_base:%s "
					"their_actual_delay:%u "
					"seq_nr:%u "
					"acked_seq_nr:%u "
					"reply_micro:%u "
					"min_rtt:%u "
					"send_buffer:%d "
					"recv_buffer:%d "
					"fast_resend_seq_nr:%d "
					"ssthres:%d "
					"\n"
					, static_cast<void*>(this)
					, sample
					, delay / 1000.0
					, their_delay / 1000.0
					, int(m_sm.target_delay() - delay) / 1000.0
					, std::uint32_t(m_cwnd >> 16)
					, 0
					, our_delay_base
					, (delay + their_delay) / 1000.0
					, m_sm.target_delay() / 1000
					, acked_bytes
					, m_bytes_in_flight
					, 0.0 // float(scaled_gain)
					, m_rtt.mean()
					, int((m_cwnd * 1000 / (m_rtt.mean()?m_rtt.mean():50)) >> 16)
					, 0
					, m_adv_wnd
					, packet_timeout()
					, int(total_milliseconds(m_timeout - receive_time))
					, int(total_microseconds(receive_time.time_since_epoch()))
					, m_outbuf.size()
					, m_mtu
					, their_delay_base
					, std::uint32_t(m_reply_micro)
					, m_seq_nr
					, m_acked_seq_nr
					, m_reply_micro
					, min_rtt / 1000
					, m_write_buffer_size
					, m_read_buffer_size
					, m_fast_resend_seq_nr
					, m_ssthres);
			}
#endif

			break;
		}
		case state_t::fin_sent:
		{
			// There are two ways we can end up in this state:
			//
			// 1. If the socket has been explicitly closed on our
			//    side, in which case m_in_eof is false.
			//
			// 2. If we received a FIN from the remote side, in which
			//    case m_in_eof is true. If this is the case, we don't
			//    come here until everything up to the FIN has been
			//    received.
			//
			//
			//

			// At this point m_seq_nr - 1 is the FIN sequence number.

			// We can receive both ST_DATA and ST_STATE here, because after
			// we have closed our end of the socket, the remote end might
			// have data in the pipeline. We don't really care about the
			// data, but we do have to ack it. Or rather, we have to ack
			// the FIN that will come after the data.

			// Case 1:
			// ---------------------------------------------------------------
			//
			// If we are here because the local endpoint was closed, we need
			// to first wait for all of our messages to be acked:
			//
			//   if (m_acked_seq_nr == ((m_seq_nr - 1) & ACK_MASK))
			//
			// `m_seq_nr - 1` is the ST_FIN message that we sent.
			//
			//                     ----------------------
			//
			// After that has happened we need to wait for the remote side
			// to send its ST_FIN message. When we receive that we send an
			// ST_STATE back to ack, and wait for a sufficient period.
			// During this wait we keep acking incoming ST_FIN's. This is
			// all handled at the top of this function.
			//
			// Note that the user handlers are all cancelled when the initial
			// close() call happens, so nothing will happen on the user side
			// after that.

			// Case 2:
			// ---------------------------------------------------------------
			//
			// If we are here because we received a ST_FIN message, and then
			// sent our own ST_FIN to ack that, we need to wait for our ST_FIN
			// to be acked:
			//
			//   if (m_acked_seq_nr == ((m_seq_nr - 1) & ACK_MASK))
			//
			// `m_seq_nr - 1` is the ST_FIN message that we sent.
			//
			// After that has happened we know the remote side has all our
			// data, and we can gracefully shut down.

			// we should still ack any incoming data to prevent potential
			// timeouts/resends at the other end
			if (ph->get_type() == ST_DATA) defer_ack();

			if (consume_incoming_data(ph, ptr, payload_size, receive_time))
			{
				break;
			}

			// we don't increment m_seq_nr when sending a FIN, so we actually
			// need to wait for m_acked_sen_nr to reach m_seq_nr before the FIN
			// is considered ACKed
			if (m_acked_seq_nr == m_seq_nr)
			{
				// When this happens we know that the remote side has
				// received all of our packets.

				UTP_LOGV("%8p: FIN acked\n", static_cast<void*>(this));

				if (!m_attached)
				{
					UTP_LOGV("%8p: close initiated here, delete socket\n"
						, static_cast<void*>(this));
					m_error = boost::asio::error::eof;
					set_state(state_t::deleting);
					test_socket_state();
				}
				else
				{
					UTP_LOGV("%8p: closing socket\n", static_cast<void*>(this));
					m_error = boost::asio::error::eof;
					set_state(state_t::error_wait);
					test_socket_state();
				}
			}

			break;
		}
		case state_t::deleting:
		case state_t::error_wait:
		{
			// respond with a reset
			send_reset(ph->seq_nr);
			break;
		}
	}
	return true;
}